

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O0

void __thiscall ll_grammar::GrammarLeft::GrammarLeft(GrammarLeft *this,string *generate,int length)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  int local_23c;
  int local_238;
  int j_4;
  int i_6;
  int j_3;
  int i_5;
  int local_204;
  int local_200;
  int local_1fc;
  int j_2;
  int i_4;
  int local_1d8;
  int local_1d4;
  int m_1;
  int j_1;
  int i_3;
  string finnalyC;
  allocator local_1a1;
  string local_1a0 [32];
  ExpressLeft local_180;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  int local_108;
  int local_104;
  int index;
  int m;
  vector<int,_std::allocator<int>_> exp;
  int local_c8;
  int local_c4;
  int j;
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  int local_88;
  int i_1;
  string local_78 [32];
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined1 local_38 [4];
  int i;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  int length_local;
  string *generate_local;
  GrammarLeft *this_local;
  
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = length;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->name_of_keys);
  std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::vector(&this->elements);
  std::vector<int,_std::allocator<int>_>::vector(&this->finally_char_index);
  std::vector<int,_std::allocator<int>_>::vector(&this->not_finally_char_index);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->first);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->follow);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->predict_table);
  std::vector<int,_std::allocator<int>_>::vector(&this->first_temp);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_38);
  for (temp.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      temp.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      temp.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58);
    std::__cxx11::string::string
              (local_78,(string *)
                        (generate +
                        (long)temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0x20));
    public_tool::parse_productions
              ((string *)local_78,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    std::__cxx11::string::~string(local_78);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_38,(value_type *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  for (local_88 = 0;
      local_88 <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_88 = local_88 + 1) {
    pvVar2 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_38,(long)local_88);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar2,0);
    std::__cxx11::string::string
              ((string *)
               &result_of_name.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar3);
    add_element(this,(string *)
                     &result_of_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    std::__cxx11::string::~string
              ((string *)
               &result_of_name.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&j);
  for (local_c4 = 0;
      local_c4 <
      vectorGenrates.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_c4 = local_c4 + 1) {
    local_c8 = 1;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar2);
      if (sVar4 <= (ulong)(long)local_c8) break;
      pvVar2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,(long)local_c8);
      std::__cxx11::string::string
                ((string *)
                 &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,(string *)pvVar3);
      public_tool::parse_elem
                ((string *)
                 &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
      std::__cxx11::string::~string
                ((string *)
                 &exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&index);
      for (local_104 = 0; uVar5 = (ulong)local_104,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j), uVar5 < sVar4; local_104 = local_104 + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&j,(long)local_104);
        std::__cxx11::string::string(local_128,(string *)pvVar3);
        iVar1 = find_name(this,(string *)local_128);
        std::__cxx11::string::~string(local_128);
        local_108 = iVar1;
        if (iVar1 == -2) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&j,(long)local_104);
          std::__cxx11::string::string(local_148,(string *)pvVar3);
          local_108 = add_element(this,(string *)local_148,true);
          std::__cxx11::string::~string(local_148);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&index,&local_108);
      }
      pvVar2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_38,(long)local_c4);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,0);
      std::__cxx11::string::string(local_168,(string *)pvVar3);
      iVar1 = find_name(this,(string *)local_168);
      pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                         (&this->elements,(long)iVar1);
      ExpressLeft::ExpressLeft(&local_180,(vector<int,_std::allocator<int>_> *)&index);
      ElemLeft::add_expression(pvVar6,&local_180);
      ExpressLeft::~ExpressLeft(&local_180);
      std::__cxx11::string::~string(local_168);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&index);
      local_c8 = local_c8 + 1;
    }
  }
  clear_left_recursion(this);
  clear_left_factor(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"#",&local_1a1);
  add_element(this,(string *)local_1a0,true);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_3,"finnaly:",(allocator *)((long)&j_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 3));
  for (m_1 = 0; uVar5 = (ulong)m_1,
      sVar4 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::size
                        (&this->elements), uVar5 < sVar4; m_1 = m_1 + 1) {
    pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                       (&this->elements,(long)m_1);
    if (((pvVar6->super_Elem).is_finally & 1U) == 0) {
      pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                         (&this->elements,(long)m_1);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar6->super_Elem).name);
      std::operator<<(poVar7,"->");
      local_1d4 = 0;
      while( true ) {
        uVar5 = (ulong)local_1d4;
        pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                 operator[](&this->elements,(long)m_1);
        sVar4 = std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::size
                          (&pvVar6->expression_of_set);
        if (sVar4 <= uVar5) break;
        local_1d8 = 0;
        while( true ) {
          uVar5 = (ulong)local_1d8;
          pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                   operator[](&this->elements,(long)m_1);
          pvVar8 = std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::
                   operator[](&pvVar6->expression_of_set,(long)local_1d4);
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)pvVar8);
          if (sVar4 <= uVar5) break;
          pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                   operator[](&this->elements,(long)m_1);
          pvVar8 = std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::
                   operator[](&pvVar6->expression_of_set,(long)local_1d4);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)pvVar8,(long)local_1d8);
          if (*pvVar9 == -1) {
            std::operator<<((ostream *)&std::cout,"@");
          }
          else {
            pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                     operator[](&this->elements,(long)m_1);
            pvVar8 = std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                     ::operator[](&pvVar6->expression_of_set,(long)local_1d4);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)pvVar8,(long)local_1d8);
            pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                     operator[](&this->elements,(long)*pvVar9);
            std::operator<<((ostream *)&std::cout,(string *)&(pvVar6->super_Elem).name);
          }
          local_1d8 = local_1d8 + 1;
        }
        std::operator<<((ostream *)&std::cout," | ");
        local_1d4 = local_1d4 + 1;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                (&this->elements,(long)m_1);
      std::operator+((char *)&j_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1232a1);
      std::__cxx11::string::operator+=((string *)&i_3,(string *)&j_2);
      std::__cxx11::string::~string((string *)&j_2);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,(string *)&i_3);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  get_tow_char_index(this);
  create_first_set(this);
  for (local_1fc = 0; uVar5 = (ulong)local_1fc,
      sVar4 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::size
                        (&this->elements), uVar5 < sVar4; local_1fc = local_1fc + 1) {
    poVar7 = std::operator<<((ostream *)&std::cout,"first[");
    pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                       (&this->elements,(long)local_1fc);
    poVar7 = std::operator<<(poVar7,(string *)&(pvVar6->super_Elem).name);
    std::operator<<(poVar7,"]={");
    local_200 = 0;
    while( true ) {
      uVar5 = (ulong)local_200;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->first,(long)local_1fc);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar4 <= uVar5) break;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->first,(long)local_1fc);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)local_200);
      if (*pvVar9 == -1) {
        std::operator<<((ostream *)&std::cout,"@ ");
      }
      else {
        pvVar10 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->first,(long)local_1fc);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)local_200);
        pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                 operator[](&this->elements,(long)*pvVar9);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar6->super_Elem).name);
        std::operator<<(poVar7," ");
      }
      local_200 = local_200 + 1;
    }
    std::operator<<((ostream *)&std::cout,"}\n");
  }
  pvVar10 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&this->follow,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_5,"#",(allocator *)((long)&j_3 + 3));
  local_204 = find_name(this,(string *)&i_5);
  std::vector<int,_std::allocator<int>_>::push_back(pvVar10,&local_204);
  std::__cxx11::string::~string((string *)&i_5);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j_3 + 3));
  create_follow_set(this);
  for (i_6 = 0; sVar4 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                        size(&this->elements), (ulong)(long)i_6 < sVar4; i_6 = i_6 + 1) {
    pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                       (&this->elements,(long)i_6);
    if (((pvVar6->super_Elem).is_finally & 1U) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"follow[");
      pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                         (&this->elements,(long)i_6);
      poVar7 = std::operator<<(poVar7,(string *)&(pvVar6->super_Elem).name);
      std::operator<<(poVar7,"]={");
      j_4 = 0;
      while( true ) {
        pvVar10 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow,(long)i_6);
        sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
        if (sVar4 <= (ulong)(long)j_4) break;
        pvVar10 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->follow,(long)i_6);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)j_4);
        if (*pvVar9 == -1) {
          std::operator<<((ostream *)&std::cout,"@ ");
        }
        else {
          pvVar10 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&this->follow,(long)i_6);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)j_4);
          pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                   operator[](&this->elements,(long)*pvVar9);
          poVar7 = std::operator<<((ostream *)&std::cout,(string *)&(pvVar6->super_Elem).name);
          std::operator<<(poVar7," ");
        }
        j_4 = j_4 + 1;
      }
      std::operator<<((ostream *)&std::cout,"}\n");
    }
  }
  get_predict_table(this);
  for (local_238 = 0;
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&this->predict_table), (ulong)(long)local_238 < sVar4;
      local_238 = local_238 + 1) {
    local_23c = 0;
    while( true ) {
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->predict_table,(long)local_238);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar4 <= (ulong)(long)local_23c) break;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->predict_table,(long)local_238);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)local_23c);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
      std::operator<<(poVar7," ");
      local_23c = local_23c + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&i_3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&j);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_38);
  return;
}

Assistant:

GrammarLeft::GrammarLeft(string* generate, int length){
    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }

    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_element(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){
        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加
        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_element(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLeft(exp));
        }
    }

    //4.消除左递归
    this->clear_left_recursion();
    //5.消除左因子
    this->clear_left_factor();

    add_element("#", true);
    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC += " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }
    //9.构造预测分析表
    this->get_predict_table();


    for (int i = 0; i < predict_table.size(); i++){
        for (int j = 0; j < predict_table[i].size(); j++){
            cout << predict_table[i][j] << " ";
        }
        cout << endl;
    }

}